

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O3

void __thiscall
TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoQuad>_>::Write
          (TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoQuad>_> *this,TPZStream *buf,
          int withclassid)

{
  long lVar1;
  
  TPZGeoEl::Write(&this->super_TPZGeoEl,buf,withclassid);
  pzgeom::TPZGeoQuad::Write(&(this->fGeo).super_TPZGeoQuad,buf,withclassid);
  (*buf->_vptr_TPZStream[8])(buf,&(this->fGeo).fR,1);
  TPZStream::Write<double>(buf,&(this->fGeo).fxc);
  lVar1 = 0;
  do {
    (**(code **)(*(long *)((long)&this->fNeighbours[0].super_TPZSavable._vptr_TPZSavable + lVar1) +
                0x28))((long)&this->fNeighbours[0].super_TPZSavable._vptr_TPZSavable + lVar1,buf,
                       withclassid);
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0xd8);
  return;
}

Assistant:

void TPZGeoElRefLess<TGeo>::Write(TPZStream &buf, int withclassid) const {
    TPZGeoEl::Write(buf, withclassid);
    fGeo.Write(buf, withclassid);
    for (unsigned int i = 0; i < TGeo::NSides; ++i) {
        this->fNeighbours[i].Write(buf, withclassid);
    }
}